

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVarSup.cpp
# Opt level: O3

Clause * __thiscall
Inferences::SubVarSup::performSubVarSup
          (SubVarSup *this,Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
          Literal *eqLit,TermList eqLHS,bool eqIsResult)

{
  ulong uVar1;
  Ordering *pOVar2;
  Stack<Kernel::Literal_*> *pSVar3;
  SubVarSup *pSVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Literal *pLVar9;
  TermList what;
  Literal *pLVar10;
  TermList TVar11;
  TermList TVar12;
  TermList arg2;
  TermList s2;
  TermList s1;
  undefined4 extraout_var;
  ulong uVar13;
  Literal **ppLVar14;
  Clause *pCVar15;
  ulong uVar16;
  ulong uVar17;
  RStack<Literal_*> resLits;
  Inference inf;
  GeneratingInference2 local_c0;
  SubVarSup *local_a8;
  Literal *local_a0;
  Inference local_98;
  Inference local_68;
  
  local_a8 = this;
  if ((performSubVarSup(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,bool)
       ::subst == '\0') &&
     (iVar8 = __cxa_guard_acquire(&performSubVarSup(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,bool)
                                   ::subst), iVar8 != 0)) {
    Kernel::RobSubstitution::RobSubstitution(&performSubVarSup::subst);
    __cxa_atexit(Kernel::RobSubstitution::~RobSubstitution,&performSubVarSup::subst,&__dso_handle);
    __cxa_guard_release(&performSubVarSup(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,bool)
                         ::subst);
  }
  Kernel::RobSubstitution::reset(&performSubVarSup::subst);
  uVar6 = Kernel::Clause::maxVar(rwClause);
  uVar7 = Kernel::Clause::maxVar(eqClause);
  if ((int)uVar7 < (int)uVar6) {
    uVar7 = uVar6;
  }
  TVar12._content._0_4_ = uVar7 * 4 + 5;
  TVar12._content._4_4_ = 0;
  uVar17 = *(ulong *)&rwClause->field_0x38;
  uVar1 = *(ulong *)&eqClause->field_0x38;
  uVar7 = (rwClause->super_Unit)._inference._age;
  uVar6 = (eqClause->super_Unit)._inference._age;
  if ((int)uVar6 < (int)uVar7) {
    uVar6 = uVar7;
  }
  local_a0 = rwLit;
  pLVar9 = Kernel::RobSubstitution::apply(&performSubVarSup::subst,rwLit,0);
  what = Kernel::RobSubstitution::apply(&performSubVarSup::subst,rwTerm,0);
  pLVar10 = Kernel::RobSubstitution::apply(&performSubVarSup::subst,eqLit,1);
  TVar11 = Kernel::RobSubstitution::apply(&performSubVarSup::subst,eqLHS,1);
  TVar12 = Kernel::RobSubstitution::apply(&performSubVarSup::subst,TVar12,0);
  arg2 = Kernel::EqHelper::getOtherEqualitySide(pLVar10,TVar11);
  s2 = Kernel::SortHelper::getEqualityArgumentSort(pLVar10);
  s1 = Kernel::SortHelper::getEqualityArgumentSort(pLVar10);
  TVar11 = ApplicativeHelper::createAppTerm(s1,s2,TVar12,TVar11,true);
  TVar12 = ApplicativeHelper::createAppTerm(s1,s2,TVar12,arg2,true);
  pSVar4 = local_a8;
  pOVar2 = (((local_a8->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
             super_InferenceEngine._salg)->_ordering)._obj;
  pLVar10 = Kernel::EqHelper::replace(pLVar9,what,TVar12);
  if ((((pLVar10->super_Term)._functor == 0) && (((pLVar10->super_Term)._args[0]._content & 4) != 0)
      ) && (uVar16 = (ulong)(*(uint *)&(pLVar10->super_Term).field_0xc & 0xfffffff),
           (pLVar10->super_Term)._args[uVar16]._content ==
           (pLVar10->super_Term)._args[uVar16 - 1]._content)) {
    return (Clause *)0x0;
  }
  iVar8 = (*(pSVar4->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
            super_InferenceEngine._vptr_InferenceEngine[4])(pSVar4);
  if (*(char *)(CONCAT44(extraout_var,iVar8) + 0x1502) == '\x01') {
    iVar8 = (*((((pSVar4->super_GeneratingInferenceEngine).super_SimplifyingGeneratingInference.
                 super_InferenceEngine._salg)->_selector)._obj)->_vptr_LiteralSelector[2])();
    cVar5 = (char)iVar8;
  }
  else {
    cVar5 = '\0';
  }
  local_c0.rule = SUB_VAR_SUP;
  local_c0.premise1 = rwClause;
  local_c0.premise2 = eqClause;
  Kernel::Inference::Inference(&local_98,&local_c0);
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           &local_c0);
  pSVar3 = (Stack<Kernel::Literal_*> *)CONCAT71(local_c0._1_7_,local_c0.rule);
  ppLVar14 = pSVar3->_cursor;
  if (ppLVar14 == pSVar3->_end) {
    Lib::Stack<Kernel::Literal_*>::expand(pSVar3);
    ppLVar14 = pSVar3->_cursor;
  }
  *ppLVar14 = pLVar10;
  pSVar3->_cursor = pSVar3->_cursor + 1;
  if ((uVar17 & 0xfffff) != 0) {
    uVar16 = 0;
    do {
      if (rwClause->_literals[uVar16] != local_a0) {
        pLVar10 = Kernel::RobSubstitution::apply
                            (&performSubVarSup::subst,rwClause->_literals[uVar16],0);
        pLVar10 = Kernel::EqHelper::replace(pLVar10,what,TVar11);
        if ((((pLVar10->super_Term)._functor == 0) &&
            (((pLVar10->super_Term)._args[0]._content & 4) != 0)) &&
           (uVar13 = (ulong)(*(uint *)&(pLVar10->super_Term).field_0xc & 0xfffffff),
           (pLVar10->super_Term)._args[uVar13]._content ==
           (pLVar10->super_Term)._args[uVar13 - 1]._content)) goto LAB_00509b0a;
        if (((cVar5 != '\0') && (uVar16 < (*(uint *)&rwClause->field_0x3c & 0xfffff))) &&
           (iVar8 = (*pOVar2->_vptr_Ordering[2])(pOVar2,pLVar10,pLVar9), iVar8 == 1)) {
          *(int *)(DAT_00b521c0 + 0x1e8) = *(int *)(DAT_00b521c0 + 0x1e8) + 1;
          goto LAB_00509b0a;
        }
        pSVar3 = (Stack<Kernel::Literal_*> *)CONCAT71(local_c0._1_7_,local_c0.rule);
        ppLVar14 = pSVar3->_cursor;
        if (ppLVar14 == pSVar3->_end) {
          Lib::Stack<Kernel::Literal_*>::expand(pSVar3);
          ppLVar14 = pSVar3->_cursor;
        }
        *ppLVar14 = pLVar10;
        pSVar3->_cursor = pSVar3->_cursor + 1;
      }
      uVar16 = uVar16 + 1;
    } while (((uint)uVar17 & 0xfffff) != uVar16);
  }
  if ((uVar1 & 0xfffff) != 0) {
    uVar17 = 0;
    do {
      if (eqClause->_literals[uVar17] != eqLit) {
        pLVar9 = Kernel::RobSubstitution::apply
                           (&performSubVarSup::subst,eqClause->_literals[uVar17],1);
        if ((((pLVar9->super_Term)._functor == 0) &&
            (((pLVar9->super_Term)._args[0]._content & 4) != 0)) &&
           (uVar16 = (ulong)(*(uint *)&(pLVar9->super_Term).field_0xc & 0xfffffff),
           (pLVar9->super_Term)._args[uVar16]._content ==
           (pLVar9->super_Term)._args[uVar16 - 1]._content)) goto LAB_00509b0a;
        pSVar3 = (Stack<Kernel::Literal_*> *)CONCAT71(local_c0._1_7_,local_c0.rule);
        ppLVar14 = pSVar3->_cursor;
        if (ppLVar14 == pSVar3->_end) {
          Lib::Stack<Kernel::Literal_*>::expand(pSVar3);
          ppLVar14 = pSVar3->_cursor;
        }
        *ppLVar14 = pLVar9;
        pSVar3->_cursor = pSVar3->_cursor + 1;
      }
      uVar17 = uVar17 + 1;
    } while (((uint)uVar1 & 0xfffff) != uVar17);
  }
  if (rwClause == eqClause) {
    *(int *)(DAT_00b521c0 + 0xfc) = *(int *)(DAT_00b521c0 + 0xfc) + 1;
  }
  else if (eqIsResult) {
    *(int *)(DAT_00b521c0 + 0xf4) = *(int *)(DAT_00b521c0 + 0xf4) + 1;
  }
  else {
    *(int *)(DAT_00b521c0 + 0xf8) = *(int *)(DAT_00b521c0 + 0xf8) + 1;
  }
  local_68._0_8_ = local_98._0_8_;
  local_68._8_4_ = local_98._8_4_;
  local_68._age = local_98._age;
  local_68._splits = local_98._splits;
  local_68._ptr1 = local_98._ptr1;
  local_68._ptr2 = local_98._ptr2;
  local_68.th_ancestors = local_98.th_ancestors;
  local_68.all_ancestors = local_98.all_ancestors;
  pCVar15 = Kernel::Clause::fromStack
                      ((Stack<Kernel::Literal_*> *)CONCAT71(local_c0._1_7_,local_c0.rule),&local_68)
  ;
  (pCVar15->super_Unit)._inference._age = uVar6 + 1;
LAB_00509ada:
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
            &local_c0);
  return pCVar15;
LAB_00509b0a:
  pCVar15 = (Clause *)0x0;
  goto LAB_00509ada;
}

Assistant:

Clause* SubVarSup::performSubVarSup(
    Clause* rwClause, Literal* rwLit, TermList rwTerm,
    Clause* eqClause, Literal* eqLit, TermList eqLHS, bool eqIsResult)
{
  // we want the rwClause and eqClause to be active
  ASS(rwClause->store()==Clause::ACTIVE);
  ASS(eqClause->store()==Clause::ACTIVE);
  ASS(rwTerm.isVar());

  //cout << "performSubVarSup with " << rwClause->toString() << " and " << eqClause->toString() << endl;
  //cout << "rwTerm " << rwTerm.toString() << " eqLHSS " << eqLHS.toString() << endl;

  static RobSubstitution subst;
  subst.reset();
  
  TermList freshVar = TermList(Int::max(rwClause->maxVar(), eqClause->maxVar()) + 1, false);

  unsigned rwLength = rwClause->length();
  unsigned eqLength = eqClause->length();

  int newAge=Int::max(rwClause->age(),eqClause->age())+1; // TODO isn't this set automatically?

  Literal* rwLitS = subst.apply(rwLit, 0);
  TermList rwTermS = subst.apply(rwTerm, 0);
  Literal* eqLitS = subst.apply(eqLit, 1);
  TermList eqLHSS = subst.apply(eqLHS, 1);
  TermList freshVarS = subst.apply(freshVar, 0); 

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLitS, eqLHSS);

  auto varSort = SortHelper::getEqualityArgumentSort(eqLitS);
  TermList eqSort = SortHelper::getEqualityArgumentSort(eqLitS);
  
  TermList newEqLHS = ApplicativeHelper::createAppTerm(eqSort, varSort, freshVarS, eqLHSS);
  TermList newTgtTm = ApplicativeHelper::createAppTerm(eqSort, varSort, freshVarS, tgtTerm);

  //ALWAYS(subst.unify(varSort, 0, varSort, 1));
  //ALWAYS(subst.unify(rwTerm, 0, newEqLHS, 1));

  Ordering& ordering = _salg->getOrdering();

  //Literal* rwLitS = subst.apply(rwLit, 0);
  //TermList rwTermS = subst.apply(rwTerm, 0);
  //newEqLHS = subst.apply(newEqLHS, 1);
  ///newTgtTm = subst.apply(newTgtTm, 1);

#if VDEBUG
   //ASS_EQ(rwTermS,newEqLHS);
#endif

  //cout << "Check ordering on " << tgtTermS.toString() << " and " << rwTermS.toString() << endl;

  /*if(rwLitS->isEquality()) {
    //check that we're not rewriting only the smaller side of an equality
    TermList arg0=*rwLitS->nthArgument(0);
    TermList arg1=*rwLitS->nthArgument(1);

    if(!arg0.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(ordering.getEqualityArgumentOrder(rwLitS))) {
        return 0;
      }
    } else if(!arg1.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(Ordering::reverse(ordering.getEqualityArgumentOrder(rwLitS)))) {
        return 0;
      }
    }
  }*/

  Literal* tgtLitS = EqHelper::replace(rwLitS,rwTermS,newTgtTm);

  //check we don't create an equational tautology (this happens during self-SubVarSup)
  if(EqHelper::isEqTautology(tgtLitS)) {
    return 0;
  }

  bool afterCheck = getOptions().literalMaximalityAftercheck() && _salg->getLiteralSelector().isBGComplete();

  Inference inf(GeneratingInference2(InferenceRule::SUB_VAR_SUP, rwClause, eqClause));
  RStack<Literal*> resLits;

  resLits->push(tgtLitS);
  for(unsigned i=0;i<rwLength;i++) {
    Literal* curr = (*rwClause)[i];
    if(curr!=rwLit) {
      Literal* currAfter = subst.apply(curr, 0);
      currAfter = EqHelper::replace(currAfter,rwTermS,newEqLHS);

      if(EqHelper::isEqTautology(currAfter)) {
        return nullptr;
      }
      
      if (afterCheck) {
        TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);
        if (i < rwClause->numSelected() && ordering.compare(currAfter,rwLitS) == Ordering::GREATER) {
          env.statistics->inferencesBlockedForOrderingAftercheck++;
          return nullptr;
        }
      }

      resLits->push(currAfter);
    }
  }


  for(unsigned i=0;i<eqLength;i++) {
    Literal* curr=(*eqClause)[i];
    if(curr!=eqLit) {
      Literal* currAfter = subst.apply(curr, 1);

      if(EqHelper::isEqTautology(currAfter)) {
        return nullptr;
      }

      resLits->push(currAfter);
    }
  } //no need for after check as no variables in D are bound to anyhting
    //the most that is happenning is a rearrangement of vars in D
  

  
  if(rwClause==eqClause) {
    env.statistics->selfSubVarSup++;
  } else if(eqIsResult) {
    env.statistics->forwardSubVarSup++;
  } else {
    env.statistics->backwardSubVarSup++;
  }

  //cout << "SUBVARSUP " + res->toString() << endl;
  auto res = Clause::fromStack(*resLits, inf);
  res->setAge(newAge);
  return res;
}